

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

void forth_cannon(Forth *ptr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  runtime_error *this;
  
  iVar1 = ForthToInt(ptr);
  if (1 < (ptr->dStack).top) {
    uVar2 = cppforth::Forth::ForthStack<unsigned_int>::getTop(&ptr->dStack,0);
    uVar3 = cppforth::Forth::ForthStack<unsigned_int>::getTop(&ptr->dStack,1);
    cppforth::Forth::forth_pop(ptr,2);
    c_cannon((long)iVar1,(ulong)uVar3,(ulong)uVar2);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"forth_cannon does not have parameters in Forth stack");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forth_cannon(cppforth::Forth* ptr){
	int num = ForthToInt(ptr);
	if (ptr->forth_depth() >= 2){
		auto range = ptr->forth_tocell(0);
		auto degree = ptr->forth_tocell(1); ptr->forth_pop(2);
		c_cannon(num, degree, range);
	}
	else {
		throw std::runtime_error(("forth_cannon does not have parameters in Forth stack"));
	}
}